

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

ssize_t __thiscall jaegertracing::thrift::Log::read(Log *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  TProtocolException *pTVar5;
  undefined4 in_register_00000034;
  uint local_6c;
  TType local_68;
  uint32_t _i7;
  TType _etype6;
  uint32_t _size3;
  bool isset_fields;
  bool isset_timestamp;
  short local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  Log *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  _etype6._3_1_ = T_STOP >> 0x18;
  _etype6._2_1_ = T_STOP >> 0x10;
  while( true ) {
    uVar1 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    if (local_4e == 1) {
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->timestamp);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        _etype6._3_1_ = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
    }
    else if (local_4e == 2) {
      if (local_4c == T_LIST) {
        std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::clear
                  (&this->fields);
        uVar1 = apache::thrift::protocol::TProtocol::readListBegin(tracker.prot_,&local_68,&_i7);
        fname.field_2._12_4_ = fname.field_2._12_4_ + uVar1;
        std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::resize
                  (&this->fields,(ulong)_i7);
        for (local_6c = 0; local_6c < _i7; local_6c = local_6c + 1) {
          pvVar4 = std::
                   vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::
                   operator[](&this->fields,(ulong)local_6c);
          iVar2 = (**(code **)(*(long *)pvVar4 + 0x10))(pvVar4,tracker.prot_);
          fname.field_2._12_4_ = iVar2 + fname.field_2._12_4_;
        }
        uVar1 = apache::thrift::protocol::TProtocol::readListEnd(tracker.prot_);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        _etype6._2_1_ = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
    }
    else {
      uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    }
    uVar1 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar3 = uVar1 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar3;
  if ((_etype6._3_1_ & 1) != T_STOP >> 0x18) {
    if ((_etype6._2_1_ & 1) != T_STOP >> 0x10) {
      std::__cxx11::string::~string((string *)local_48);
      apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
                ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
      return (ulong)uVar3;
    }
    pTVar5 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(pTVar5,INVALID_DATA);
    __cxa_throw(pTVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  pTVar5 = (TProtocolException *)__cxa_allocate_exception(0x30);
  apache::thrift::protocol::TProtocolException::TProtocolException(pTVar5,INVALID_DATA);
  __cxa_throw(pTVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
              apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t Log::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_timestamp = false;
  bool isset_fields = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->timestamp);
          isset_timestamp = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->fields.clear();
            uint32_t _size3;
            ::apache::thrift::protocol::TType _etype6;
            xfer += iprot->readListBegin(_etype6, _size3);
            this->fields.resize(_size3);
            uint32_t _i7;
            for (_i7 = 0; _i7 < _size3; ++_i7)
            {
              xfer += this->fields[_i7].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_fields = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_timestamp)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_fields)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}